

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

XMLNode * __thiscall tinyxml2::XMLText::ShallowClone(XMLText *this,XMLDocument *doc)

{
  int iVar1;
  undefined4 extraout_var;
  char *str;
  XMLText *pXVar2;
  XMLDocument *this_00;
  
  this_00 = (this->super_XMLNode)._document;
  iVar1 = (*(this->super_XMLNode)._vptr_XMLNode[9])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    str = StrPair::GetStr(&(this->super_XMLNode)._value);
  }
  else {
    str = (char *)0x0;
  }
  if (doc != (XMLDocument *)0x0) {
    this_00 = doc;
  }
  pXVar2 = XMLDocument::NewText(this_00,str);
  pXVar2->_isCData = this->_isCData;
  return &pXVar2->super_XMLNode;
}

Assistant:

XMLNode* XMLText::ShallowClone( XMLDocument* doc ) const
{
    if ( !doc ) {
        doc = _document;
    }
    XMLText* text = doc->NewText( Value() );	// fixme: this will always allocate memory. Intern?
    text->SetCData( this->CData() );
    return text;
}